

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

tc_toktyp_t __thiscall
CTcTokenizer::actual_splice_next_line
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcToken *tok)

{
  size_t sVar1;
  int iVar2;
  tc_toktyp_t tVar3;
  tc_toktyp_t unaff_EBP;
  bool bVar4;
  
  (*(this->linebuf_)._vptr_CTcTokString[2])(&this->linebuf_,(this->linebuf_).buf_len_ + 1);
  (this->linebuf_).buf_[(this->linebuf_).buf_len_] = ' ';
  sVar1 = (this->linebuf_).buf_len_;
  (this->linebuf_).buf_len_ = sVar1 + 1;
  (this->linebuf_).buf_[sVar1 + 1] = '\0';
  do {
    iVar2 = read_line(this,1);
    if (this->in_quote_ != L'\0') {
      splice_string(this);
    }
    if (iVar2 == -1) {
      bVar4 = false;
      unaff_EBP = TOKT_EOF;
    }
    else {
      src->p_ = (this->linebuf_).buf_ + iVar2;
      tVar3 = next_on_line(srcbuf,src,tok,&this->macro_in_embedding_,1);
      bVar4 = tVar3 == TOKT_EOF;
      if (!bVar4) {
        unaff_EBP = tVar3;
      }
    }
  } while (bVar4);
  return unaff_EBP;
}

Assistant:

tc_toktyp_t CTcTokenizer::actual_splice_next_line(
    const CTcTokString *srcbuf, utf8_ptr *src, CTcToken *tok)
{
    /* add a space onto the end of the current line */
    linebuf_.append(" ", 1);

    /* keep going until we find a non-empty line */
    for (;;)
    {
        int new_line_ofs;
        tc_toktyp_t typ;

        /* splice the next line onto the current line */
        new_line_ofs = read_line(TRUE);

        /* 
         *   make sure we read additional lines as needed to complete any
         *   strings left open at the end of the line 
         */
        if (in_quote_ != '\0')
            splice_string();

        /* if there was no more, return end of file */
        if (new_line_ofs == -1)
            return TOKT_EOF;

        /* set the source to the start of the additional line */
        src->set((char *)linebuf_.get_text() + new_line_ofs);

        /* get the next token */
        typ = next_on_line(srcbuf, src, tok, &macro_in_embedding_, TRUE);

        /* if we didn't get EOF, it means we found a non-empty line */
        if (typ != TOKT_EOF)
            return typ;
    }
}